

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O2

void __thiscall RhombicCode::sweep(RhombicCode *this,string *direction,bool greedy)

{
  uint vertexIndex;
  int iVar1;
  int iVar2;
  uint *puVar3;
  pointer pvVar4;
  pointer piVar5;
  pointer pcVar6;
  bool bVar7;
  iterator iVar8;
  length_error *this_00;
  invalid_argument *piVar9;
  string *sweepDirection;
  undefined7 in_register_00000011;
  uint *puVar10;
  long lVar11;
  pointer piVar12;
  cartesian4 cVar13;
  allocator local_c6;
  allocator local_c5;
  int edge;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_c0;
  vstr sweepEdges;
  string local_98 [32];
  string local_78 [32];
  vstr edgeDirections;
  
  local_c0 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             CONCAT44(local_c0._4_4_,(int)CONCAT71(in_register_00000011,greedy));
  Code::clearFlipBits(&this->super_Code);
  edgeDirections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edgeDirections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edgeDirections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = std::operator==(direction,"xyz");
  if (bVar7) {
    std::__cxx11::string::string((string *)&sweepEdges,"xy",(allocator *)&edge);
    std::__cxx11::string::string(local_98,"yz",&local_c5);
    std::__cxx11::string::string(local_78,"xz",&local_c6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&edgeDirections,
               &sweepEdges,&edgeDirections);
    lVar11 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&sweepEdges.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x20);
  }
  else {
    bVar7 = std::operator==(direction,"xy");
    if (bVar7) {
      std::__cxx11::string::string((string *)&sweepEdges,"xyz",(allocator *)&edge);
      std::__cxx11::string::string(local_98,"-xz",&local_c5);
      std::__cxx11::string::string(local_78,"-yz",&local_c6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &edgeDirections,&sweepEdges,&edgeDirections);
      lVar11 = 0x40;
      do {
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&sweepEdges.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11));
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x20);
    }
    else {
      bVar7 = std::operator==(direction,"xz");
      if (bVar7) {
        std::__cxx11::string::string((string *)&sweepEdges,"xyz",(allocator *)&edge);
        std::__cxx11::string::string(local_98,"-xy",&local_c5);
        std::__cxx11::string::string(local_78,"-yz",&local_c6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &edgeDirections,&sweepEdges,&edgeDirections);
        lVar11 = 0x40;
        do {
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&sweepEdges.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar11));
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != -0x20);
      }
      else {
        bVar7 = std::operator==(direction,"yz");
        if (bVar7) {
          std::__cxx11::string::string((string *)&sweepEdges,"xyz",(allocator *)&edge);
          std::__cxx11::string::string(local_98,"-xy",&local_c5);
          std::__cxx11::string::string(local_78,"-xz",&local_c6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &edgeDirections,&sweepEdges,&edgeDirections);
          lVar11 = 0x40;
          do {
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&sweepEdges.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar11));
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x20);
        }
        else {
          bVar7 = std::operator==(direction,"-xyz");
          if (bVar7) {
            std::__cxx11::string::string((string *)&sweepEdges,"-xy",(allocator *)&edge);
            std::__cxx11::string::string(local_98,"-yz",&local_c5);
            std::__cxx11::string::string(local_78,"-xz",&local_c6);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &edgeDirections,&sweepEdges,&edgeDirections);
            lVar11 = 0x40;
            do {
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&sweepEdges.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11));
              lVar11 = lVar11 + -0x20;
            } while (lVar11 != -0x20);
          }
          else {
            bVar7 = std::operator==(direction,"-xy");
            if (bVar7) {
              std::__cxx11::string::string((string *)&sweepEdges,"-xyz",(allocator *)&edge);
              std::__cxx11::string::string(local_98,"xz",&local_c5);
              std::__cxx11::string::string(local_78,"yz",&local_c6);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &edgeDirections,&sweepEdges,&edgeDirections);
              lVar11 = 0x40;
              do {
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&sweepEdges.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11));
                lVar11 = lVar11 + -0x20;
              } while (lVar11 != -0x20);
            }
            else {
              bVar7 = std::operator==(direction,"-xz");
              if (bVar7) {
                std::__cxx11::string::string((string *)&sweepEdges,"-xyz",(allocator *)&edge);
                std::__cxx11::string::string(local_98,"xy",&local_c5);
                std::__cxx11::string::string(local_78,"yz",&local_c6);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &edgeDirections,&sweepEdges,&edgeDirections);
                lVar11 = 0x40;
                do {
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&sweepEdges.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar11));
                  lVar11 = lVar11 + -0x20;
                } while (lVar11 != -0x20);
              }
              else {
                bVar7 = std::operator==(direction,"-yz");
                if (!bVar7) {
                  piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument(piVar9,"Invalid sweep direction.");
                  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                std::__cxx11::string::string((string *)&sweepEdges,"-xyz",(allocator *)&edge);
                std::__cxx11::string::string(local_98,"xy",&local_c5);
                std::__cxx11::string::string(local_78,"xz",&local_c6);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &edgeDirections,&sweepEdges,&edgeDirections);
                lVar11 = 0x40;
                do {
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&sweepEdges.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar11));
                  lVar11 = lVar11 + -0x20;
                } while (lVar11 != -0x20);
              }
            }
          }
        }
      }
    }
  }
  puVar10 = (uint *)(this->super_Code).sweepIndices.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (uint *)(this->super_Code).sweepIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar10 == puVar3) {
      sweepEdges.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      iVar1 = *(int *)&(this->super_Code).flipBits.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      iVar2 = *(int *)&(this->super_Code).flipBits.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      local_c0 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &(this->super_Code).error;
      for (; (int)sweepEdges.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start < iVar1 - iVar2;
          sweepEdges.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ =
               (int)sweepEdges.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1) {
        if ((this->super_Code).flipBits.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)sweepEdges.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start] != '\0') {
          iVar8 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)local_c0,(key_type *)&sweepEdges);
          if ((_Rb_tree_header *)iVar8._M_node ==
              &(this->super_Code).error._M_t._M_impl.super__Rb_tree_header) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(local_c0,(int *)&sweepEdges);
          }
          else {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            erase_abi_cxx11_(local_c0,(const_iterator)iVar8._M_node);
          }
          if (1 < (this->super_Code).sweepRate) {
            pvVar4 = (this->super_Code).faceToEdges.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar5 = pvVar4[(int)sweepEdges.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar12 = pvVar4[(int)sweepEdges.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar12 != piVar5;
                piVar12 = piVar12 + 1) {
              edge = *piVar12;
              if (((this->super_Code).boundaries != true) ||
                 (iVar8 = std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::find(&(this->super_Code).syndromeIndices._M_t,&edge),
                 (_Rb_tree_header *)iVar8._M_node !=
                 &(this->super_Code).syndromeIndices._M_t._M_impl.super__Rb_tree_header)) {
                pcVar6 = (this->super_Code).syndrome.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pcVar6[edge] = (char)((int)(short)(pcVar6[edge] + 1) % 2);
              }
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&edgeDirections);
      return;
    }
    vertexIndex = *puVar10;
    if (((char)local_c0 != '\0') ||
       (bVar7 = Code::checkExtremalVertex(&this->super_Code,vertexIndex,direction), bVar7)) {
      (*(this->super_Code)._vptr_Code[3])(&sweepEdges,this,(ulong)vertexIndex,direction);
      if (0x80 < (ulong)((long)sweepEdges.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)CONCAT44(sweepEdges.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)sweepEdges.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start))) {
        this_00 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error
                  (this_00,"More than four up-edges found for a rhombic lattice vertex.");
        __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      if (sweepEdges.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pointer)CONCAT44(sweepEdges.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)sweepEdges.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) {
        cVar13 = Lattice::indexToCoordinate
                           ((this->super_Code).lattice._M_t.
                            super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                            super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                            super__Head_base<0UL,_Lattice_*,_false>._M_head_impl,vertexIndex);
        if (((long)sweepEdges.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             CONCAT44(sweepEdges.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (int)sweepEdges.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) != 0x20) ||
           ((this->super_Code).boundaries != false)) {
          sweepDirection = (string *)(cVar13._8_8_ >> 0x20);
          if (sweepDirection == (string *)0x0) {
            if ((cVar13.z + cVar13.x + cVar13.y) % 2 != this->latticeParity) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar9,"Vertex not present in lattice has up-edges.");
              __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((this->super_Code).boundaries == true) {
              sweepFullVertexBoundary(this,vertexIndex,&sweepEdges,direction,&edgeDirections);
            }
            else {
              sweepFullVertex(this,vertexIndex,&sweepEdges,direction,&edgeDirections);
            }
          }
          else if ((this->super_Code).boundaries == true) {
            sweepHalfVertexBoundary(this,vertexIndex,&sweepEdges,direction,&edgeDirections);
          }
          else {
            sweepHalfVertex(this,vertexIndex,&sweepEdges,sweepDirection,&edgeDirections);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sweepEdges);
    }
    puVar10 = puVar10 + 1;
  } while( true );
}

Assistant:

void RhombicCode::sweep(const std::string &direction, bool greedy)
{
    clearFlipBits();
    vstr edgeDirections;
    if (direction == "xyz")
    {
        edgeDirections = {"xy", "yz", "xz"};
    }
    else if (direction == "xy")
    {
        edgeDirections = {"xyz", "-xz", "-yz"};
    }
    else if (direction == "xz")
    {
        edgeDirections = {"xyz", "-xy", "-yz"};
    }
    else if (direction == "yz")
    {
        edgeDirections = {"xyz", "-xy", "-xz"};
    }
    else if (direction == "-xyz")
    {
        edgeDirections = {"-xy", "-yz", "-xz"};
    }
    else if (direction == "-xy")
    {
        edgeDirections = {"-xyz", "xz", "yz"};
    }
    else if (direction == "-xz")
    {
        edgeDirections = {"-xyz", "xy", "yz"};
    }
    else if (direction == "-yz")
    {
        edgeDirections = {"-xyz", "xy", "xz"};
    }
    else
    {
        throw std::invalid_argument("Invalid sweep direction.");
    }
    // for (int vertexIndex = 0; vertexIndex < 2 * pow(l, 3); ++vertexIndex)
    for (auto const vertexIndex : sweepIndices)
    {
        if (!greedy)
        {
            if (!checkExtremalVertex(vertexIndex, direction))
            {
                continue;
            }
        }
        // std::cout << "Trying to find sweep edges... ";
        vstr sweepEdges = findSweepEdges(vertexIndex, direction);
        // if (sweepEdges.size() > 0)
        // {
        //     std::cerr << "Vertex = " << lattice->indexToCoordinate(vertexIndex) << std::endl;
        //     for (auto &e : sweepEdges)
        //     {
        //         std::cerr << e << std::endl;
        //     }
        // }
        // std::cout << "FOUND." << std::endl;
        if (sweepEdges.size() > 4)
        {
            throw std::length_error("More than four up-edges found for a rhombic lattice vertex.");
        }
        if (sweepEdges.size() == 0)
        {
            continue;
        }
        cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
        // if (sweepEdges.size() == 1 && (!boundaries || coordinate.w == 0))
        if (sweepEdges.size() == 1 && !boundaries)
        {
            continue;
        }
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (boundaries)
                {
                    sweepFullVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
                }
                else
                {
                    sweepFullVertex(vertexIndex, sweepEdges, direction, edgeDirections);
                }
            }
            else
            {
                throw std::invalid_argument("Vertex not present in lattice has up-edges.");
            }
        }
        else
        {
            if (boundaries)
            {
                sweepHalfVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
            }
            else
            {
                sweepHalfVertex(vertexIndex, sweepEdges, direction, edgeDirections);
            }
        }
    }
    for (int i = 0, imax = flipBits.size(); i < imax; ++i)
    {
        if (flipBits[i])
        {
            auto it = error.find(i);
            if (it != error.end())
            {
                error.erase(it);
            }
            else
            {
                error.insert(i);
            }
            if (sweepRate > 1)
            {
                for (const int edge : faceToEdges[i])
                {
                    // std::cerr << edge << std::endl;
                    if (boundaries)
                    {
                        auto it2 = syndromeIndices.find(edge);
                        if (it2 == syndromeIndices.end())
                        {
                            continue;
                        }
                    }
                    syndrome[edge] = (syndrome[edge] + 1) % 2;
                }
            }
        }
    }
}